

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::Logger::unregister_client(Logger *this,LoggerClient *c)

{
  int *piVar1;
  key_type local_10;
  
  if (c != (LoggerClient *)0x0) {
    piVar1 = &(c->super_Counted).nb_refs_;
    *piVar1 = *piVar1 + 1;
  }
  local_10.pointer_ = c;
  std::
  _Rb_tree<GEO::SmartPointer<GEO::LoggerClient>,_GEO::SmartPointer<GEO::LoggerClient>,_std::_Identity<GEO::SmartPointer<GEO::LoggerClient>_>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
  ::erase(&(this->clients_)._M_t,&local_10);
  SmartPointer<GEO::LoggerClient>::~SmartPointer(&local_10);
  return;
}

Assistant:

void Logger::unregister_client(LoggerClient* c) {
        geo_debug_assert(clients_.find(c) != clients_.end());
	clients_.erase(c);
    }